

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<float,_4> __thiscall
tcu::refract<float,4>(tcu *this,Vector<float,_4> *i,Vector<float,_4> *n,float eta)

{
  float fVar1;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar2;
  float fVar3;
  Vector<float,_4> VVar4;
  Vector<float,_4> VVar5;
  Vector<float,_4> local_38;
  tcu local_28 [16];
  undefined1 auVar6 [12];
  undefined8 uVar7;
  
  fVar1 = dot<float,4>(n,i);
  fVar3 = 1.0 - eta * eta * (1.0 - fVar1 * fVar1);
  uVar2 = 0;
  if (0.0 <= fVar3) {
    operator*((tcu *)&local_38,eta,i);
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    operator*(local_28,eta * fVar1 + fVar3,n);
    VVar4 = operator-(this,&local_38,(Vector<float,_4> *)local_28);
  }
  else {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar4.m_data[2] = (float)(int)uVar2;
    VVar4.m_data[3] = (float)(int)((ulong)uVar2 >> 0x20);
    VVar4.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar4.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar5.m_data[0] = VVar4.m_data[0];
  auVar6._4_4_ = VVar4.m_data[1];
  register0x00001240 = VVar4.m_data[2];
  register0x00001244 = VVar4.m_data[3];
  return (Vector<float,_4>)VVar5.m_data;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}